

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O3

CURLdigest Curl_input_digest(connectdata *conn,_Bool proxy,char *header)

{
  SessionHandle *pSVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ushort **ppuVar6;
  long lVar7;
  char *pcVar8;
  char *first;
  bool bVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte bVar13;
  undefined7 in_register_00000031;
  byte bVar14;
  uint uVar15;
  digestdata *d;
  bool bVar16;
  char *tok_buf;
  char value [256];
  char content [1024];
  char *local_540;
  byte local_538 [256];
  byte local_438 [1032];
  
  pSVar1 = conn->data;
  iVar5 = Curl_raw_nequal("Digest",header,6);
  if (iVar5 == 0) {
    return CURLDIGEST_NONE;
  }
  uVar15 = (int)CONCAT71(in_register_00000031,proxy) << 6;
  d = (digestdata *)((long)&(pSVar1->state).digest.nonce + (ulong)uVar15);
  pbVar12 = (byte *)(header + 6);
  pcVar2 = d->nonce;
  digest_cleanup_one(d);
  bVar4 = false;
  bVar9 = false;
  do {
    bVar13 = *pbVar12;
    if (bVar13 != 0) {
      ppuVar6 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar6 + (ulong)bVar13 * 2 + 1) & 0x20) == 0) goto LAB_004c43e3;
        bVar13 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
      } while (bVar13 != 0);
    }
    bVar13 = 0;
LAB_004c43e3:
    lVar10 = 0;
    for (lVar7 = 0; ((bVar13 != 0 && (bVar13 != 0x3d)) && ((int)lVar7 != 0xff)); lVar7 = lVar7 + 1)
    {
      local_538[lVar7] = bVar13;
      bVar13 = pbVar12[lVar7 + 1];
      lVar10 = lVar10 + -1;
    }
    local_538[lVar7] = 0;
    if (pbVar12[lVar7] != 0x3d) {
      if ((pcVar2 != (char *)0x0) && ((&(pSVar1->state).digest.stale)[uVar15] != true)) {
        return CURLDIGEST_BAD;
      }
      return (uint)(d->nonce != (char *)0x0) * 3 + CURLDIGEST_BAD;
    }
    bVar13 = pbVar12[lVar7 + 1];
    pbVar11 = pbVar12 + 2;
    if (bVar13 != 0x22) {
      pbVar11 = pbVar12 + 1;
    }
    pbVar12 = pbVar11 + -lVar10;
    bVar14 = *pbVar12;
    pbVar11 = local_438;
    if (bVar14 != 0) {
      iVar5 = 0x3ff;
      bVar3 = false;
      do {
        bVar16 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar16) break;
        if (bVar14 < 0x22) {
          if ((bVar14 != 10) && (bVar14 != 0xd)) goto LAB_004c4492;
LAB_004c447c:
          iVar5 = 0;
        }
        else {
          if (bVar14 == 0x22) {
            if ((bool)(bVar13 == 0x22 & (bVar3 ^ 1U))) goto LAB_004c447c;
LAB_004c4492:
            bVar16 = false;
          }
          else {
            if (bVar14 == 0x2c) {
              if (bVar13 != 0x22) goto LAB_004c447c;
              goto LAB_004c4492;
            }
            if ((bVar14 != 0x5c) || (bVar16 = true, bVar3)) goto LAB_004c4492;
          }
          bVar3 = bVar16;
          *pbVar11 = bVar14;
          pbVar11 = pbVar11 + 1;
        }
        bVar14 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
      } while (bVar14 != 0);
    }
    *pbVar11 = 0;
    iVar5 = Curl_raw_equal((char *)local_538,"nonce");
    if (iVar5 != 0) {
      pcVar8 = (*Curl_cstrdup)((char *)local_438);
      d->nonce = pcVar8;
      goto LAB_004c44d6;
    }
    iVar5 = Curl_raw_equal((char *)local_538,"stale");
    if (iVar5 != 0) {
      iVar5 = Curl_raw_equal((char *)local_438,"true");
      if (iVar5 != 0) {
        (&(pSVar1->state).digest.stale)[uVar15] = true;
        *(undefined4 *)((long)&(pSVar1->state).digest.nc + (ulong)uVar15) = 1;
      }
      goto LAB_004c44df;
    }
    iVar5 = Curl_raw_equal((char *)local_538,"realm");
    if (iVar5 == 0) {
      iVar5 = Curl_raw_equal((char *)local_538,"opaque");
      if (iVar5 != 0) {
        pcVar8 = (*Curl_cstrdup)((char *)local_438);
        *(char **)((long)&(pSVar1->state).digest.opaque + (ulong)uVar15) = pcVar8;
        goto LAB_004c44d6;
      }
      iVar5 = Curl_raw_equal((char *)local_538,"qop");
      if (iVar5 != 0) {
        pcVar8 = (*Curl_cstrdup)((char *)local_438);
        if (pcVar8 == (char *)0x0) {
          return CURLDIGEST_NOMEM;
        }
        first = strtok_r(pcVar8,",",&local_540);
        while (first != (char *)0x0) {
          iVar5 = Curl_raw_equal(first,"auth");
          if (iVar5 == 0) {
            iVar5 = Curl_raw_equal(first,"auth-int");
            bVar9 = (bool)(bVar9 | iVar5 != 0);
          }
          else {
            bVar4 = true;
          }
          first = strtok_r((char *)0x0,",",&local_540);
        }
        (*Curl_cfree)(pcVar8);
        if (bVar4) {
          pcVar8 = "auth";
        }
        else {
          if (!bVar9) goto LAB_004c44df;
          pcVar8 = "auth-int";
        }
        pcVar8 = (*Curl_cstrdup)(pcVar8);
        *(char **)((long)&(pSVar1->state).digest.qop + (ulong)uVar15) = pcVar8;
        goto LAB_004c44d6;
      }
      iVar5 = Curl_raw_equal((char *)local_538,"algorithm");
      if (iVar5 != 0) {
        pcVar8 = (*Curl_cstrdup)((char *)local_438);
        *(char **)((long)&(pSVar1->state).digest.algorithm + (ulong)uVar15) = pcVar8;
        if (pcVar8 == (char *)0x0) {
          return CURLDIGEST_NOMEM;
        }
        iVar5 = Curl_raw_equal((char *)local_438,"MD5-sess");
        if (iVar5 == 0) {
          iVar5 = Curl_raw_equal((char *)local_438,"MD5");
          if (iVar5 == 0) {
            return CURLDIGEST_BADALGO;
          }
          *(undefined4 *)((long)&(pSVar1->state).digest.algo + (ulong)uVar15) = 0;
        }
        else {
          *(undefined4 *)((long)&(pSVar1->state).digest.algo + (ulong)uVar15) = 1;
        }
      }
    }
    else {
      pcVar8 = (*Curl_cstrdup)((char *)local_438);
      *(char **)((long)&(pSVar1->state).digest.realm + (ulong)uVar15) = pcVar8;
LAB_004c44d6:
      if (pcVar8 == (char *)0x0) {
        return CURLDIGEST_NOMEM;
      }
    }
LAB_004c44df:
    bVar13 = *pbVar12;
    if (bVar13 != 0) {
      ppuVar6 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar6 + (ulong)bVar13 * 2 + 1) & 0x20) == 0) {
          pbVar12 = pbVar12 + (bVar13 == 0x2c);
          break;
        }
        bVar13 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
      } while (bVar13 != 0);
    }
  } while( true );
}

Assistant:

CURLdigest Curl_input_digest(struct connectdata *conn,
                             bool proxy,
                             const char *header) /* rest of the *-authenticate:
                                                    header */
{
  char *token = NULL;
  char *tmp = NULL;
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  struct SessionHandle *data=conn->data;
  bool before = FALSE; /* got a nonce before */
  struct digestdata *d;

  if(proxy) {
    d = &data->state.proxydigest;
  }
  else {
    d = &data->state.digest;
  }

  if(checkprefix("Digest", header)) {
    header += strlen("Digest");

    /* If we already have received a nonce, keep that in mind */
    if(d->nonce)
      before = TRUE;

    /* clear off any former leftovers and init to defaults */
    digest_cleanup_one(d);

    for(;;) {
      char value[MAX_VALUE_LENGTH];
      char content[MAX_CONTENT_LENGTH];

      while(*header && ISSPACE(*header))
        header++;

      /* extract a value=content pair */
      if(!get_pair(header, value, content, &header)) {
        if(Curl_raw_equal(value, "nonce")) {
          d->nonce = strdup(content);
          if(!d->nonce)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "stale")) {
          if(Curl_raw_equal(content, "true")) {
            d->stale = TRUE;
            d->nc = 1; /* we make a new nonce now */
          }
        }
        else if(Curl_raw_equal(value, "realm")) {
          d->realm = strdup(content);
          if(!d->realm)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "opaque")) {
          d->opaque = strdup(content);
          if(!d->opaque)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "qop")) {
          char *tok_buf;
          /* tokenize the list and choose auth if possible, use a temporary
             clone of the buffer since strtok_r() ruins it */
          tmp = strdup(content);
          if(!tmp)
            return CURLDIGEST_NOMEM;
          token = strtok_r(tmp, ",", &tok_buf);
          while(token != NULL) {
            if(Curl_raw_equal(token, "auth")) {
              foundAuth = TRUE;
            }
            else if(Curl_raw_equal(token, "auth-int")) {
              foundAuthInt = TRUE;
            }
            token = strtok_r(NULL, ",", &tok_buf);
          }
          free(tmp);
          /*select only auth o auth-int. Otherwise, ignore*/
          if(foundAuth) {
            d->qop = strdup("auth");
            if(!d->qop)
              return CURLDIGEST_NOMEM;
          }
          else if(foundAuthInt) {
            d->qop = strdup("auth-int");
            if(!d->qop)
              return CURLDIGEST_NOMEM;
          }
        }
        else if(Curl_raw_equal(value, "algorithm")) {
          d->algorithm = strdup(content);
          if(!d->algorithm)
            return CURLDIGEST_NOMEM;
          if(Curl_raw_equal(content, "MD5-sess"))
            d->algo = CURLDIGESTALGO_MD5SESS;
          else if(Curl_raw_equal(content, "MD5"))
            d->algo = CURLDIGESTALGO_MD5;
          else
            return CURLDIGEST_BADALGO;
        }
        else {
          /* unknown specifier, ignore it! */
        }
      }
      else
        break; /* we're done here */

      /* pass all additional spaces here */
      while(*header && ISSPACE(*header))
        header++;
      if(',' == *header)
        /* allow the list to be comma-separated */
        header++;
    }
    /* We had a nonce since before, and we got another one now without
       'stale=true'. This means we provided bad credentials in the previous
       request */
    if(before && !d->stale)
      return CURLDIGEST_BAD;

    /* We got this header without a nonce, that's a bad Digest line! */
    if(!d->nonce)
      return CURLDIGEST_BAD;
  }
  else
    /* else not a digest, get out */
    return CURLDIGEST_NONE;

  return CURLDIGEST_FINE;
}